

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O3

char * ON_ErrorEvent::TypeToString(Type event_type)

{
  if (event_type < 8) {
    return *(char **)(&DAT_0080f490 + (ulong)event_type * 8);
  }
  return "Invalid";
}

Assistant:

const char* ON_ErrorEvent::TypeToString(
  ON_ErrorEvent::Type event_type
)
{
  const char* s;
  switch (event_type)
  {
  case ON_ErrorEvent::Type::Unset:
    s = "Unset";
    break;
  case ON_ErrorEvent::Type::Warning:
    s = "Warning";
    break;
  case ON_ErrorEvent::Type::Error:
    s = "Error";
    break;
  case ON_ErrorEvent::Type::Assert:
    s = "Assert";
    break;
  case ON_ErrorEvent::Type::Custom:
    s = "Custom";
    break;
  case ON_ErrorEvent::Type::SubDError:
    s = "SubDError";
    break;
  case ON_ErrorEvent::Type::NotValid:
    s = "NotValid";
    break;
  default:
    s = "Invalid";
    break;
  }

  return s;
}